

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O2

void __thiscall gvr::MultiTexturedMesh::loadPLY(MultiTexturedMesh *this,PLYReader *ply)

{
  string *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ply_type pVar4;
  ply_type pVar5;
  ply_type pVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  bool bVar11;
  string sStack_408;
  string local_3e8;
  allocator local_3c6;
  allocator local_3c5;
  allocator local_3c4;
  allocator local_3c3;
  allocator local_3c2;
  allocator local_3c1;
  allocator local_3c0;
  allocator local_3bf;
  allocator local_3be;
  allocator local_3bd;
  allocator local_3bc;
  allocator local_3bb;
  allocator local_3ba;
  allocator local_3b9;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  FloatArrayReceiver ny;
  FloatArrayReceiver vx;
  string local_2c8;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  TriangleReceiver tr;
  FloatArrayReceiver vy;
  MultiTextureIndexReceiver ti;
  MultiTextureCoordReceiver tc;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar7 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY((Model *)this,ply);
  this_00 = &this->basepath;
  std::__cxx11::string::assign((char *)this_00);
  lVar8 = std::__cxx11::string::find_last_of((char *)this_00,0x15c008);
  if (lVar8 == -1) {
    std::__cxx11::string::assign((char *)this_00);
  }
  else {
    std::__cxx11::string::substr((ulong)&vx,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)&vx);
    std::__cxx11::string::~string((string *)&vx);
  }
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(ply,&comment);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[0xb])(this,0);
  lVar8 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)comment.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)comment.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar10 = uVar10 + 1) {
    lVar9 = std::__cxx11::string::find
                      ((char *)((long)&((comment.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8),0x15bff0);
    if (lVar9 == 0) {
LAB_0013239a:
      std::__cxx11::string::substr
                ((ulong)&vx,
                 (long)&((comment.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8);
      gutil::trim((string *)&vx);
      (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[0xb])
                (this,(ulong)((int)((ulong)((long)(this->name).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->name).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             1));
      pbVar1 = (this->name).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->name).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string((string *)&local_50,(string *)&vx);
      setTextureName(this,(int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5) + -1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&vx);
    }
    else {
      lVar9 = std::__cxx11::string::find
                        ((char *)((long)&((comment.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar8),0x15bffc);
      if (lVar9 == 0) goto LAB_0013239a;
    }
    lVar8 = lVar8 + 0x20;
  }
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  pVar4 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar10 = 1;
  if (pVar4 == ply_none) {
    std::__cxx11::string::string((string *)&local_70,"vertex",&local_3b9);
    std::__cxx11::string::string((string *)&local_90,"scan_error",&local_3ba);
    pVar5 = PLYReader::getTypeOfProperty(ply,&local_70,&local_90);
    if (pVar5 != ply_none) goto LAB_001324f6;
    std::__cxx11::string::string((string *)&local_b0,"vertex",&local_3bb);
    std::__cxx11::string::string((string *)&local_d0,"scan_conf",&local_3bc);
    pVar5 = PLYReader::getTypeOfProperty(ply,&local_b0,&local_d0);
    uVar10 = (ulong)(pVar5 != ply_none);
    bVar11 = true;
  }
  else {
LAB_001324f6:
    bVar11 = false;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar5 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar5 == ply_none) {
LAB_001325ed:
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,"vertex",&local_3bd);
    std::__cxx11::string::string((string *)&local_110,"sy",&local_3be);
    pVar6 = PLYReader::getTypeOfProperty(ply,&local_f0,&local_110);
    if (pVar6 == ply_none) goto LAB_001325ed;
    std::__cxx11::string::string((string *)&local_130,"vertex",&local_3bf);
    std::__cxx11::string::string((string *)&local_150,"sz",&local_3c0);
    PLYReader::getTypeOfProperty(ply,&local_130,&local_150);
    bVar3 = true;
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,lVar7,uVar10);
  if (bVar3) {
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
  }
  if (pVar5 != ply_none) {
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if (bVar11) {
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (pVar4 == ply_none) {
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,(this->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,(this->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,(this->super_Mesh).super_PointCloud.vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,(this->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,(this->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,(this->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((this->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,(this->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,(this->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,(this->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sx",(allocator *)&sStack_408);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sy",(allocator *)&sStack_408);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sz",(allocator *)&sStack_408);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&nx,(this->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&ny,(this->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&nz,(this->super_Mesh).normal,3,2);
  std::__cxx11::string::string((string *)&sStack_408,"vertex",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"nx",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&nx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  std::__cxx11::string::string((string *)&sStack_408,"vertex",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"ny",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&ny.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  std::__cxx11::string::string((string *)&sStack_408,"vertex",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"nz",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&nz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  std::__cxx11::string::string((string *)&sStack_408,"face",(allocator *)&local_3e8);
  uVar10 = PLYReader::instancesOfElement(ply,&sStack_408);
  std::__cxx11::string::~string((string *)&sStack_408);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar10 & 0xffffffff);
  tr.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00173258;
  tr.p = &this->super_Mesh;
  std::__cxx11::string::string((string *)&sStack_408,"face",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"vertex_index",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  std::__cxx11::string::string((string *)&sStack_408,"face",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"vertex_indices",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  tc.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00173410;
  ti.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00173440;
  ti.p = this;
  tc.p = this;
  std::__cxx11::string::string((string *)&sStack_408,"face",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"texcoord",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&tc.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  std::__cxx11::string::string((string *)&sStack_408,"face",(allocator *)&local_2a8);
  std::__cxx11::string::string((string *)&local_3e8,"texnumber",(allocator *)&local_2c8);
  PLYReader::setReceiver(ply,&sStack_408,&local_3e8,&ti.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&sStack_408);
  PLYReader::readData(ply);
  std::__cxx11::string::string((string *)&sStack_408,"vertex",&local_3c1);
  std::__cxx11::string::string((string *)&local_3e8,"nx",&local_3c2);
  pVar4 = PLYReader::getTypeOfProperty(ply,&sStack_408,&local_3e8);
  if (pVar4 == ply_none) {
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&sStack_408);
  }
  else {
    std::__cxx11::string::string((string *)&local_2a8,"vertex",&local_3c3);
    std::__cxx11::string::string((string *)&local_2c8,"ny",&local_3c4);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_2a8,&local_2c8);
    if (pVar4 == ply_none) {
      bVar11 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_170,"vertex",&local_3c5);
      std::__cxx11::string::string((string *)&local_190,"nz",&local_3c6);
      pVar4 = PLYReader::getTypeOfProperty(ply,&local_170,&local_190);
      bVar11 = pVar4 == ply_none;
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&sStack_408);
    if (!bVar11) {
      Mesh::normalizeNormals(&this->super_Mesh);
      goto LAB_00133017;
    }
  }
  Mesh::recalculateNormals(&this->super_Mesh);
LAB_00133017:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment);
  return;
}

Assistant:

void MultiTexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  basepath=ply.getName();

  size_t j=basepath.find_last_of("/\\");

  if (j != basepath.npos)
  {
    basepath=basepath.substr(0, j+1);
  }
  else
  {
    basepath="";
  }

  // get names of textures

  std::vector<std::string> comment;
  ply.getComments(comment);

  resizeTextureList(0);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      std::string s=comment[i].substr(11);
      gutil::trim(s);

      resizeTextureList(getTextureCount()+1);
      setTextureName(getTextureCount()-1, s);
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  MultiTextureCoordReceiver tc(*this);
  MultiTextureIndexReceiver ti(*this);

  ply.setReceiver("face", "texcoord", &tc);
  ply.setReceiver("face", "texnumber", &ti);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}